

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3NestedParse(Parse *pParse,char *zFormat,...)

{
  Token *__src;
  sqlite3 *db;
  char in_AL;
  char *zSql;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *zErrMsg;
  va_list ap;
  char saveBuf [160];
  char *local_1b0;
  __va_list_tag local_1a8;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined1 local_d8 [168];
  
  if (in_AL != '\0') {
    local_158 = in_XMM0_Qa;
    local_148 = in_XMM1_Qa;
    local_138 = in_XMM2_Qa;
    local_128 = in_XMM3_Qa;
    local_118 = in_XMM4_Qa;
    local_108 = in_XMM5_Qa;
    local_f8 = in_XMM6_Qa;
    local_e8 = in_XMM7_Qa;
  }
  local_1b0 = (char *)0x0;
  if (pParse->nErr == 0) {
    db = pParse->db;
    local_1a8.reg_save_area = local_188;
    local_1a8.overflow_arg_area = &zErrMsg;
    local_1a8.gp_offset = 0x10;
    local_1a8.fp_offset = 0x30;
    local_178 = in_RDX;
    local_170 = in_RCX;
    local_168 = in_R8;
    local_160 = in_R9;
    zSql = sqlite3VMPrintf(db,zFormat,&local_1a8);
    if (zSql == (char *)0x0) {
      if (db->mallocFailed == '\0') {
        pParse->rc = 0x12;
      }
      pParse->nErr = pParse->nErr + 1;
    }
    else {
      pParse->nested = pParse->nested + '\x01';
      __src = &pParse->sLastToken;
      memcpy(local_d8,__src,0xa0);
      memset(__src,0,0xa0);
      sqlite3RunParser(pParse,zSql,&local_1b0);
      sqlite3DbFree(db,local_1b0);
      sqlite3DbFreeNN(db,zSql);
      memcpy(__src,local_d8,0xa0);
      pParse->nested = pParse->nested + 0xff;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3NestedParse(Parse *pParse, const char *zFormat, ...){
  va_list ap;
  char *zSql;
  char *zErrMsg = 0;
  sqlite3 *db = pParse->db;
  char saveBuf[PARSE_TAIL_SZ];

  if( pParse->nErr ) return;
  assert( pParse->nested<10 );  /* Nesting should only be of limited depth */
  va_start(ap, zFormat);
  zSql = sqlite3VMPrintf(db, zFormat, ap);
  va_end(ap);
  if( zSql==0 ){
    /* This can result either from an OOM or because the formatted string
    ** exceeds SQLITE_LIMIT_LENGTH.  In the latter case, we need to set
    ** an error */
    if( !db->mallocFailed ) pParse->rc = SQLITE_TOOBIG;
    pParse->nErr++;
    return;
  }
  pParse->nested++;
  memcpy(saveBuf, PARSE_TAIL(pParse), PARSE_TAIL_SZ);
  memset(PARSE_TAIL(pParse), 0, PARSE_TAIL_SZ);
  sqlite3RunParser(pParse, zSql, &zErrMsg);
  sqlite3DbFree(db, zErrMsg);
  sqlite3DbFree(db, zSql);
  memcpy(PARSE_TAIL(pParse), saveBuf, PARSE_TAIL_SZ);
  pParse->nested--;
}